

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

xml_document * xml_parse_document(uint8_t *buffer,size_t length)

{
  xml_node *pxVar1;
  xml_document *pxVar2;
  char *message;
  xml_parser parser;
  xml_parser local_30;
  
  local_30.position = 0;
  local_30.buffer = buffer;
  local_30.length = length;
  if (length == 0) {
    message = "xml_parse_document::length equals zero";
  }
  else {
    pxVar1 = xml_parse_node(&local_30);
    if (pxVar1 != (xml_node *)0x0) {
      pxVar2 = (xml_document *)malloc(0x18);
      (pxVar2->buffer).buffer = buffer;
      (pxVar2->buffer).length = length;
      pxVar2->root = pxVar1;
      return pxVar2;
    }
    message = "xml_parse_document::parsing document failed";
  }
  xml_parser_error(&local_30,NO_CHARACTER,message);
  return (xml_document *)0x0;
}

Assistant:

struct xml_document* xml_parse_document(uint8_t* buffer, size_t length) {

	/* Initialize parser
	 */
	struct xml_parser parser = {
		.buffer = buffer,
		.position = 0,
		.length = length
	};

	/* An empty buffer can never contain a valid document
	 */
	if (!length) {
		xml_parser_error(&parser, NO_CHARACTER, "xml_parse_document::length equals zero");
		return 0;
	}

	/* Parse the root node
	 */
	struct xml_node* root = xml_parse_node(&parser);
	if (!root) {
		xml_parser_error(&parser, NO_CHARACTER, "xml_parse_document::parsing document failed");
		return 0;
	}

	/* Return parsed document
	 */
	struct xml_document* document = malloc(sizeof(struct xml_document));
	document->buffer.buffer = buffer;
	document->buffer.length = length;
	document->root = root;

	return document;
}